

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O3

void libcellml::findAndReplaceComponentCnUnitsNames
               (ComponentPtr *component,string *oldName,string *newName)

{
  _Alloc_hider _Var1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  pointer psVar5;
  XmlNodePtr rootNode;
  string newMath;
  string originalMath;
  string newMathContent;
  vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
  mathDocs;
  string mathContent;
  XmlNodePtr local_e8;
  string local_d8;
  string local_b8;
  string local_98;
  ComponentPtr *local_78;
  string *local_70;
  vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
  local_68;
  string local_50;
  
  local_70 = newName;
  Component::math_abi_cxx11_
            (&local_50,
             (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr);
  if (local_50._M_string_length != 0) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    local_98._M_string_length = 0;
    local_98.field_2._M_local_buf[0] = '\0';
    multiRootXml(&local_68,&local_50);
    if (local_68.
        super__Vector_base<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_68.
        super__Vector_base<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      bVar3 = false;
      psVar5 = local_68.
               super__Vector_base<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_78 = component;
      do {
        XmlDoc::rootNode((XmlDoc *)&local_e8);
        bVar2 = XmlNode::isMathmlElement
                          (local_e8.
                           super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           ,"math");
        if (bVar2) {
          XmlNode::convertToString_abi_cxx11_
                    (&local_b8,
                     local_e8.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          findAndReplaceCnUnitsNames(&local_e8,oldName,local_70);
          XmlNode::convertToString_abi_cxx11_
                    (&local_d8,
                     local_e8.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_d8._M_dataplus._M_p);
          _Var1._M_p = local_d8._M_dataplus._M_p;
          if (local_d8._M_string_length == local_b8._M_string_length) {
            if (local_d8._M_string_length != 0) {
              iVar4 = bcmp(local_d8._M_dataplus._M_p,local_b8._M_dataplus._M_p,
                           local_d8._M_string_length);
              if (iVar4 != 0) goto LAB_002597b8;
            }
          }
          else {
LAB_002597b8:
            bVar3 = true;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var1._M_p != &local_d8.field_2) {
            operator_delete(_Var1._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
        }
        if (local_e8.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_e8.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        psVar5 = psVar5 + 1;
      } while (psVar5 != local_68.
                         super__Vector_base<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
      if (bVar3) {
        Component::setMath((local_78->
                           super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr,&local_98);
      }
    }
    std::
    vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
    ::~vector(&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,
                      CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                               local_98.field_2._M_local_buf[0]) + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void findAndReplaceComponentCnUnitsNames(const ComponentPtr &component, const std::string &oldName, const std::string &newName)
{
    std::string mathContent = component->math();
    if (mathContent.empty()) {
        return;
    }
    bool contentModified = false;
    std::string newMathContent;
    std::vector<XmlDocPtr> mathDocs = multiRootXml(mathContent);
    for (const auto &doc : mathDocs) {
        auto rootNode = doc->rootNode();
        if (rootNode->isMathmlElement("math")) {
            auto originalMath = rootNode->convertToString();
            findAndReplaceCnUnitsNames(rootNode, oldName, newName);
            auto newMath = rootNode->convertToString();
            newMathContent += newMath;
            if (newMath != originalMath) {
                contentModified = true;
            }
        }
    }

    if (contentModified) {
        component->setMath(newMathContent);
    }
}